

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_freeAttributes__implies
          (ColladaParserAutoGen15Private *this,void *attributeData)

{
  if (*(long *)((long)attributeData + 0xf8) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  if (*(long *)((long)attributeData + 0x208) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  implies__AttributeData::~implies__AttributeData((implies__AttributeData *)attributeData);
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_freeAttributes__implies( void* attributeData )
{
    implies__AttributeData* typedAttributeData = static_cast<implies__AttributeData*>(attributeData);
    if (typedAttributeData->_class.data)
    {
        mStackMemoryManager.deleteObject();
    }

    if (typedAttributeData->unknownAttributes.data)
    {
        mStackMemoryManager.deleteObject();
    }


    typedAttributeData->~implies__AttributeData();

    return true;
}